

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearTex2DCase::iterate(ClearTex2DCase *this)

{
  RenderContext *renderCtx;
  TestLog *log;
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint height;
  char *description;
  uint x;
  uint width;
  uint y;
  uint uVar6;
  bool bVar7;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  TextureLevel reference;
  TextureLevel result;
  ObjectWrapper local_118;
  ObjectWrapper local_100;
  ConstPixelBufferAccess local_e8;
  ObjectWrapper local_c0;
  TextureLevel local_a8;
  TextureLevel local_80;
  ConstPixelBufferAccess local_58;
  long lVar4;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar5 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_c0,(Functions *)CONCAT44(extraout_var_00,iVar2),pOVar5);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar5 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_100,(Functions *)CONCAT44(extraout_var_01,iVar2),pOVar5);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar5 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&local_118,(Functions *)CONCAT44(extraout_var_02,iVar2),pOVar5);
  local_a8.m_format.order = RGBA;
  local_a8.m_format.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(&local_80,&local_a8.m_format,0x7d,0x75,1);
  local_e8.m_format.order = S;
  local_e8.m_format.type = UNSIGNED_INT8;
  tcu::TextureLevel::TextureLevel(&local_a8,&local_e8.m_format,0x7d,0x75,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  (**(code **)(lVar4 + 0xa0))(0x8d41,local_100.m_object);
  (**(code **)(lVar4 + 0x1238))(0x8d41,0x8236,0x7d,0x75);
  (**(code **)(lVar4 + 0xb8))(0xde1,local_118.m_object);
  (**(code **)(lVar4 + 0x1380))(0xde1,1,this->m_format,0x7d,0x75);
  (**(code **)(lVar4 + 0x78))(0x8d40,local_c0.m_object);
  (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41,local_100.m_object);
  (**(code **)(lVar4 + 0x6a0))(0x8d40,0x821a,0xde1,local_118.m_object,0);
  checkFramebufferStatus(*(Functions **)(lVar4 + 0x170));
  (**(code **)(lVar4 + 0x5e0))(0xc11);
  y = 0;
  do {
    height = 0x75 - y;
    if (7 < height) {
      height = 8;
    }
    uVar1 = (y ^ 0x3d) * 9;
    x = 0xfffffff8;
    uVar6 = 0x7d;
    do {
      x = x + 8;
      width = 8;
      if (uVar6 < 8) {
        width = uVar6;
      }
      uVar3 = (x ^ 0x3d) * 9;
      uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d ^ (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
      uVar3 = (uVar3 >> 0xf ^ uVar3) & 0xff;
      (**(code **)(lVar4 + 0x208))(uVar3);
      (**(code **)(lVar4 + 0x1290))(x,y,width,height);
      (**(code **)(lVar4 + 0x188))(0x400);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_58,&local_a8);
      tcu::getSubregion((PixelBufferAccess *)&local_e8,(PixelBufferAccess *)&local_58,x,y,width,
                        height);
      tcu::clearStencil((PixelBufferAccess *)&local_e8,uVar3);
      uVar6 = uVar6 - 8;
    } while (x < 0x75);
    bVar7 = y < 0x6d;
    y = y + 8;
  } while (bVar7);
  (**(code **)(lVar4 + 0x4e8))(0xc11);
  (**(code **)(lVar4 + 0x688))(0x8d40,0x821a,0x8d41,0);
  checkFramebufferStatus(*(Functions **)(lVar4 + 0x170));
  blitStencilToColor2D(renderCtx,local_118.m_object,0x7d,0x75);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_e8,&local_80);
  glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)&local_e8);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_e8,&local_a8);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58,&local_80);
  bVar7 = compareStencilToRed(log,&local_e8,&local_58);
  description = "Image comparison failed";
  if (bVar7) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar7,description
            );
  tcu::TextureLevel::~TextureLevel(&local_a8);
  tcu::TextureLevel::~TextureLevel(&local_80);
  glu::ObjectWrapper::~ObjectWrapper(&local_118);
  glu::ObjectWrapper::~ObjectWrapper(&local_100);
  glu::ObjectWrapper::~ObjectWrapper(&local_c0);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&		gl				= renderCtx.getFunctions();
		const int					width			= 125;
		const int					height			= 117;
		const int					cellSize		= 8;
		glu::Framebuffer			fbo				(renderCtx);
		glu::Renderbuffer			colorBuf		(renderCtx);
		glu::Texture				depthStencilTex	(renderCtx);
		TextureLevel				result			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				reference		(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D, *depthStencilTex, 0);
		checkFramebufferStatus(gl);

		gl.enable(GL_SCISSOR_TEST);

		for (int y = 0; y < height; y += cellSize)
		{
			for (int x = 0; x < width; x += cellSize)
			{
				const int		clearW		= de::min(cellSize, width-x);
				const int		clearH		= de::min(cellSize, height-y);
				const int		stencil		= int((deInt32Hash(x) ^ deInt32Hash(y)) & 0xff);

				gl.clearStencil(stencil);
				gl.scissor(x, y, clearW, clearH);
				gl.clear(GL_STENCIL_BUFFER_BIT);

				tcu::clearStencil(tcu::getSubregion(reference.getAccess(), x, y, clearW, clearH), stencil);
			}
		}

		gl.disable(GL_SCISSOR_TEST);

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, result.getAccess());

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), reference, result);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}